

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m256v_U_mult_inplace(m256v *LU,m256v *X_inout)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (0 < LU->n_col) {
    lVar5 = 1;
    lVar2 = 0;
    do {
      if (LU->n_row <= lVar2) {
        return;
      }
      m256v_mult_row(X_inout,(int)lVar2,LU->e[lVar2 + LU->rstride * lVar2]);
      lVar3 = lVar2 + 1;
      lVar1 = (long)LU->n_col;
      lVar4 = lVar5;
      if (lVar3 < lVar1) {
        do {
          m256v_multadd_row_from
                    (X_inout,(int)lVar4,0,LU->e[lVar4 + LU->rstride * lVar2],X_inout,(int)lVar2);
          lVar4 = lVar4 + 1;
          lVar1 = (long)LU->n_col;
        } while ((int)lVar4 < LU->n_col);
      }
      lVar5 = lVar5 + 1;
      lVar2 = lVar3;
    } while (lVar3 < lVar1);
  }
  return;
}

Assistant:

void MV_GEN_N(_U_mult_inplace)(const MV_GEN_TYPE* LU, MV_GEN_TYPE* X_inout)
{
	for (int i = 0; i < LU->n_col && i < LU->n_row; ++i) {
		MV_GEN_N(_mult_row)(X_inout, i, MV_GEN_N(_get_el)(LU, i, i));
		for (int j = i + 1; j < LU->n_col; ++j) {
			MV_GEN_N(_multadd_row)(X_inout, j,
					MV_GEN_N(_get_el)(LU, i, j),
					X_inout, i);
		}
	}
}